

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testInvalidMeanSquaredErrorLossLayerInputs(void)

{
  RepeatedField<long> *this;
  pointer pcVar1;
  float fVar2;
  WeightParams *pWVar3;
  bool bVar4;
  int iVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  TypeUnion TVar10;
  Type *this_00;
  LayerUnion this_01;
  WeightParams *pWVar11;
  NetworkUpdateParameters *this_02;
  Type *this_03;
  CategoricalCrossEntropyLossLayer *this_04;
  ostream *poVar12;
  Rep *pRVar13;
  int iVar14;
  int iVar15;
  Result res;
  Model m;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Model local_58;
  
  CoreML::Specification::Model::Model(&local_58);
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_58.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"A","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
    pFVar8 = pTVar7->type_;
    if (pFVar8 == (FeatureType *)0x0) {
      pFVar8 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar8);
      pTVar7->type_ = pFVar8;
    }
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9->datatype_ = 0x10020;
  this = &pAVar9->shape_;
  iVar15 = (pAVar9->shape_).current_size_;
  iVar14 = (pAVar9->shape_).total_size_;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar15 + 1);
    iVar15 = (pAVar9->shape_).current_size_;
    iVar14 = (pAVar9->shape_).total_size_;
  }
  pRVar13 = (pAVar9->shape_).rep_;
  iVar5 = iVar15 + 1;
  (pAVar9->shape_).current_size_ = iVar5;
  pRVar13->elements[iVar15] = 1;
  if (iVar5 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar15 + 2);
    iVar5 = (pAVar9->shape_).current_size_;
    iVar14 = (pAVar9->shape_).total_size_;
    pRVar13 = (pAVar9->shape_).rep_;
  }
  iVar15 = iVar5 + 1;
  this->current_size_ = iVar15;
  pRVar13->elements[iVar5] = 1;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar5 + 2);
    iVar15 = (pAVar9->shape_).current_size_;
    pRVar13 = (pAVar9->shape_).rep_;
  }
  this->current_size_ = iVar15 + 1;
  pRVar13->elements[iVar15] = 1;
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_58.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"B","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9->datatype_ = 0x10020;
  local_58.isupdatable_ = true;
  local_58.specificationversion_ = 4;
  if (local_58._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_58);
    local_58._oneof_case_[0] = 500;
    TVar10.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar10.neuralnetwork_);
    local_58.Type_.pipelineclassifier_ = TVar10.pipelineclassifier_;
  }
  TVar10 = local_58.Type_;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_58.Type_.pipeline_)->models_,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"inner_layer","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_00->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"B");
  this_00->isupdatable_ = true;
  if (this_00->_oneof_case_[0] == 0x8c) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x8c;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_01.innerproduct_);
    (this_00->layer_).innerproduct_ = (InnerProductLayerParams *)this_01;
  }
  (this_01.innerproduct_)->inputchannels_ = 1;
  (this_01.innerproduct_)->outputchannels_ = 1;
  pWVar11 = (WeightParams *)((this_01.activation_)->NonlinearityType_).linear_;
  if (pWVar11 == (WeightParams *)0x0) {
    pWVar11 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar11);
    ((this_01.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar11;
  }
  fVar2 = (float)(pWVar11->floatvalue_).current_size_;
  if (fVar2 == (float)(pWVar11->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar11->floatvalue_,(int)fVar2 + 1);
    fVar2 = (float)(pWVar11->floatvalue_).current_size_;
    pWVar3 = (WeightParams *)((this_01.activation_)->NonlinearityType_).linear_;
    (pWVar11->floatvalue_).current_size_ = (int)fVar2 + 1;
    ((pWVar11->floatvalue_).rep_)->elements[(int)fVar2] = 1.0;
    pWVar11 = pWVar3;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar11 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar11);
      ((this_01.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar11;
    }
  }
  else {
    (pWVar11->floatvalue_).current_size_ = (int)fVar2 + 1;
    ((pWVar11->floatvalue_).rep_)->elements[(int)fVar2] = 1.0;
  }
  pWVar11->isupdatable_ = true;
  (this_01.innerproduct_)->hasbias_ = true;
  pWVar11 = (this_01.innerproduct_)->bias_;
  if (pWVar11 == (WeightParams *)0x0) {
    pWVar11 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar11);
    (this_01.innerproduct_)->bias_ = pWVar11;
  }
  iVar15 = (pWVar11->floatvalue_).current_size_;
  if (iVar15 == (pWVar11->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar11->floatvalue_,iVar15 + 1);
    iVar15 = (pWVar11->floatvalue_).current_size_;
    pWVar3 = (this_01.innerproduct_)->bias_;
    (pWVar11->floatvalue_).current_size_ = iVar15 + 1;
    ((pWVar11->floatvalue_).rep_)->elements[iVar15] = 1.0;
    pWVar11 = pWVar3;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar11 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar11);
      (this_01.innerproduct_)->bias_ = pWVar11;
    }
  }
  else {
    (pWVar11->floatvalue_).current_size_ = iVar15 + 1;
    ((pWVar11->floatvalue_).rep_)->elements[iVar15] = 1.0;
  }
  pWVar11->isupdatable_ = true;
  this_02 = (TVar10.neuralnetworkregressor_)->updateparams_;
  if (this_02 == (NetworkUpdateParameters *)0x0) {
    this_02 = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this_02);
    (TVar10.neuralnetworkregressor_)->updateparams_ = this_02;
  }
  this_03 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                      (&(this_02->losslayers_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"mse_loss_layer","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_03->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (this_03->_oneof_case_[0] == 0xb) {
    this_04 = (this_03->LossLayerType_).categoricalcrossentropylosslayer_;
  }
  else {
    CoreML::Specification::LossLayer::clear_LossLayerType(this_03);
    this_03->_oneof_case_[0] = 0xb;
    this_04 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
    CoreML::Specification::MeanSquaredErrorLossLayer::MeanSquaredErrorLossLayer
              ((MeanSquaredErrorLossLayer *)this_04);
    (this_03->LossLayerType_).meansquarederrorlosslayer_ = (MeanSquaredErrorLossLayer *)this_04;
  }
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"C","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_04->input_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"label_target","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_04->target_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  CoreML::Model::validate((Result *)local_80,&local_58);
  bVar4 = CoreML::Result::good((Result *)local_80);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1fc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_58);
  return (uint)bVar4;
}

Assistant:

int testInvalidMeanSquaredErrorLossLayerInputs() {

    /* at least one of the inputs of the loss layer must be produced within the inference network,
     otherwise the model is invalid.
     */

    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    shape->add_shape(1);
    shape->add_shape(1);
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    auto *type_out = out->mutable_type()->mutable_multiarraytype();
    type_out->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    m.set_isupdatable(true);
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    auto *nn = m.mutable_neuralnetwork();
    auto *l1 = nn->add_layers();
    l1->set_name("inner_layer");
    l1->add_input("A");
    l1->add_output("B");
    l1->set_isupdatable(true);
    Specification::InnerProductLayerParams *innerProductParams = l1->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);
    innerProductParams->mutable_weights()->add_floatvalue(1.0);
    innerProductParams->mutable_weights()->set_isupdatable(true);
    innerProductParams->set_hasbias(true);
    innerProductParams->mutable_bias()->add_floatvalue(1.0);
    innerProductParams->mutable_bias()->set_isupdatable(true);

    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("mse_loss_layer");

    Specification::MeanSquaredErrorLossLayer *mseLossLayer = lossLayer->mutable_meansquarederrorlosslayer();
    mseLossLayer->set_input("C");
    mseLossLayer->set_target("label_target");

    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}